

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

char * get_multiple_arg_token_next(char *arg)

{
  size_t sVar1;
  char *in_RDI;
  char *tok;
  char *local_18;
  char *local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    for (local_18 = strchr(in_RDI,0x2c); (local_18 != (char *)0x0 && (local_18[-1] == '\\'));
        local_18 = strchr(local_18 + 1,0x2c)) {
    }
    if ((local_18 == (char *)0x0) || (sVar1 = strlen(local_18), sVar1 == 1)) {
      local_8 = (char *)0x0;
    }
    else {
      local_8 = local_18 + 1;
    }
  }
  return local_8;
}

Assistant:

static const char *
get_multiple_arg_token_next(const char *arg)
{
  const char *tok;

  if (!arg)
    return 0;

  tok = strchr (arg, ',');

  /* make sure it is not escaped */
  while (tok)
    {
      if (*(tok-1) == '\\')
        {
          /* find the next one */
          tok = strchr (tok+1, ',');
        }
      else
        break;
    }

  if (! tok || strlen(tok) == 1)
    return 0;

  return tok+1;
}